

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentStamp.cpp
# Opt level: O0

bool __thiscall OpenMD::FragmentStamp::addNodesStamp(FragmentStamp *this,NodesStamp *nodes)

{
  value_type *in_RDI;
  vector<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::NodesStamp_*,_std::allocator<OpenMD::NodesStamp_*>_>::push_back
            (unaff_retaddr,in_RDI);
  return true;
}

Assistant:

bool FragmentStamp::addNodesStamp(NodesStamp* nodes) {
    nodesStamps_.push_back(nodes);
    return true;
  }